

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proxylogger.cpp
# Opt level: O0

void __thiscall MyClass::MyClass(MyClass *this)

{
  ProxyLogger *in_RDI;
  allocator<char> local_29;
  string local_28 [8];
  allocator<char> *in_stack_ffffffffffffffe0;
  char *in_stack_ffffffffffffffe8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffff0;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffff0,in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0);
  liblogger::ProxyLogger::ProxyLogger(in_RDI,local_28);
  std::__cxx11::string::~string(local_28);
  std::allocator<char>::~allocator(&local_29);
  return;
}

Assistant:

MyClass() :
            ProxyLogger("TESTPROXY")
        {

        }